

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O0

bool __thiscall
burst::buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::equal
          (buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *this,
          buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *that)

{
  bool bVar1;
  bool local_21;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *that_local;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *this_local;
  
  bVar1 = std::operator==(&this->m_end,&that->m_end);
  if (!bVar1) {
    __assert_fail("this->m_end == that.m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                  ,0x6b,
                  "bool burst::buffered_chunk_iterator<std::_List_const_iterator<char>, int>::equal(const buffered_chunk_iterator<Iterator, Integral> &) const [Iterator = std::_List_const_iterator<char>, Integral = int]"
                 );
  }
  bVar1 = std::operator==(&this->m_chunk,&that->m_chunk);
  if (bVar1) {
    if (this->m_chunk_size != that->m_chunk_size) {
      __assert_fail("this->m_chunk_size == that.m_chunk_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                    ,0x6d,
                    "bool burst::buffered_chunk_iterator<std::_List_const_iterator<char>, int>::equal(const buffered_chunk_iterator<Iterator, Integral> &) const [Iterator = std::_List_const_iterator<char>, Integral = int]"
                   );
    }
    bVar1 = std::operator==(&this->m_current,&that->m_current);
    local_21 = false;
    if (bVar1) {
      local_21 = empty(this);
    }
    return local_21;
  }
  __assert_fail("this->m_chunk == that.m_chunk",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                ,0x6c,
                "bool burst::buffered_chunk_iterator<std::_List_const_iterator<char>, int>::equal(const buffered_chunk_iterator<Iterator, Integral> &) const [Iterator = std::_List_const_iterator<char>, Integral = int]"
               );
}

Assistant:

bool equal (const buffered_chunk_iterator & that) const
        {
            assert(this->m_end == that.m_end);
            assert(this->m_chunk == that.m_chunk);
            assert(this->m_chunk_size == that.m_chunk_size);
            return this->m_current == that.m_current && empty();
        }